

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

float ma_dr_wav_bytes_to_f32(ma_uint8 *data)

{
  return *(float *)data;
}

Assistant:

MA_API float ma_dr_wav_bytes_to_f32(const ma_uint8* data)
{
    union {
        ma_uint32 u32;
        float f32;
    } value;
    value.u32 = ma_dr_wav_bytes_to_u32(data);
    return value.f32;
}